

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O0

void do_offer(CHAR_DATA *ch,char *argument)

{
  undefined8 uVar1;
  bool bVar2;
  MYSQL_ROW ppcVar3;
  OBJ_DATA *pOVar4;
  char *format;
  char *in_RSI;
  long in_RDI;
  int status;
  char *escape;
  char query [4608];
  OBJ_DATA *altar;
  OBJ_DATA *obj;
  MYSQL_ROW row;
  void *arg2;
  OBJ_DATA *in_stack_ffffffffffffedc0;
  uint in_stack_ffffffffffffedc8;
  int in_stack_ffffffffffffedcc;
  char *in_stack_ffffffffffffedd0;
  char local_1228 [8];
  OBJ_DATA *in_stack_ffffffffffffede0;
  char *in_stack_ffffffffffffffc0;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  CHAR_DATA *pCVar5;
  
  for (pCVar5 = (CHAR_DATA *)object_list;
      (pCVar5 != (CHAR_DATA *)0x0 &&
      (((pCVar5->hunting == (CHAR_DATA *)0x0 || (*(short *)&pCVar5->carrying != 0x29)) ||
       (pCVar5->hunting != *(CHAR_DATA **)(in_RDI + 0xa8))))); pCVar5 = pCVar5->next) {
  }
  if (((pCVar5 == (CHAR_DATA *)0x0) || (*(char **)&pCVar5->hunting->group == (char *)0x0)) ||
     (bVar2 = str_cmp(*(char **)&pCVar5->hunting->group,""), !bVar2)) {
    send_to_char(in_stack_ffffffffffffedd0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8));
    return;
  }
  bVar2 = str_cmp(in_RSI,"");
  if (!bVar2) {
    sprintf(local_1228,
            "SELECT * FROM offerings WHERE deity = \"%s\" AND player = \"%s\" ORDER BY time DESC LIMIT 1"
            ,*(char **)&pCVar5->hunting->group,*(undefined8 *)(in_RDI + 0xf0));
    ppcVar3 = one_query_row((char *)in_stack_ffffffffffffedc0);
    if (ppcVar3 == (MYSQL_ROW)0x0) {
      send_to_char(in_stack_ffffffffffffedd0,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8));
      return;
    }
    in_stack_ffffffffffffedcc = atoi(ppcVar3[4]);
    if (in_stack_ffffffffffffedcc == 2) {
      send_to_char(in_stack_ffffffffffffedd0,(CHAR_DATA *)CONCAT44(2,in_stack_ffffffffffffedc8));
      return;
    }
    if (in_stack_ffffffffffffedcc == 1) {
      send_to_char(in_stack_ffffffffffffedd0,(CHAR_DATA *)CONCAT44(1,in_stack_ffffffffffffedc8));
      return;
    }
    if (in_stack_ffffffffffffedcc == 0) {
      send_to_char(in_stack_ffffffffffffedd0,(CHAR_DATA *)(ulong)in_stack_ffffffffffffedc8);
      return;
    }
  }
  pOVar4 = get_obj_carry(pCVar5,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (pOVar4 == (OBJ_DATA *)0x0) {
    send_to_char(in_stack_ffffffffffffedd0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8));
  }
  else {
    bVar2 = can_drop_obj((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
                         in_stack_ffffffffffffedc0);
    if (bVar2) {
      format = escape_string(in_stack_ffffffffffffffc0);
      pCVar5 = pCVar5->hunting;
      uVar1._0_2_ = pCVar5->group;
      uVar1._2_2_ = pCVar5->cabal;
      uVar1._4_2_ = pCVar5->sex;
      uVar1._6_2_ = pCVar5->race;
      arg2 = (void *)current_time;
      sprintf(local_1228,"INSERT INTO offerings VALUES(\"%s\", %d, \"%s\", \'%s\', 0, %ld, nullptr)"
              ,uVar1,(ulong)(uint)(int)pOVar4->pIndexData->vnum,format,
              *(undefined8 *)(in_RDI + 0xf0));
      one_query((char *)in_stack_ffffffffffffedc0);
      act(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
          in_stack_ffffffffffffedc0,arg2,0);
      act(format,(CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),
          in_stack_ffffffffffffedc0,arg2,0);
      extract_obj(in_stack_ffffffffffffede0);
    }
    else {
      send_to_char(in_stack_ffffffffffffedd0,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8));
    }
  }
  return;
}

Assistant:

void do_offer(CHAR_DATA *ch, char *argument)
{
	MYSQL_ROW row;
	OBJ_DATA *obj, *altar;
	char query[MSL];
	char *escape;
	int status;

	// status: 0 unread 1 rejected 2 accepted
	for (altar = object_list; altar; altar = altar->next)
	{
		if (altar->in_room && altar->item_type == ITEM_ALTAR && altar->in_room == ch->in_room)
			break;
	}

	if (!altar || !altar->in_room->owner || !str_cmp(altar->in_room->owner, ""))
	{
		send_to_char("There's no altar here.\n\r", ch);
		return;
	}

	if (!str_cmp(argument, ""))
	{
		sprintf(query, "SELECT * FROM offerings WHERE deity = \"%s\" AND player = \"%s\" ORDER BY time DESC LIMIT 1",
			altar->in_room->owner,
			ch->true_name);

		row = one_query_row(query);

		if (!row)
		{
			send_to_char("You find no signs of any offerings you may have made.\n\r", ch);
			return;
		}

		status = atoi(row[4]);
		if (status == 2)
		{
			send_to_char("Your offering seems to have been accepted.\n\r", ch);
			return;
		}

		if (status == 1)
		{
			send_to_char("The other offerings that were here have been accepted, but yours has been left untouched.\n\r", ch);
			return;
		}

		if (status == 0)
		{
			send_to_char("The pile of offerings doesn't appear to have been disturbed since your last visit.\n\r", ch);
			return;
		}
	}

	obj = get_obj_carry(ch, argument, ch);

	if (!obj)
	{
		send_to_char("You don't have that item.\n\r", ch);
		return;
	}

	if (!can_drop_obj(ch, obj))
	{
		send_to_char("You can't let go of it.\n\r", ch);
		return;
	}

	escape = escape_string(obj->short_descr);

	sprintf(query, "INSERT INTO offerings VALUES(\"%s\", %d, \"%s\", '%s', 0, %ld, nullptr)",
		altar->in_room->owner,
		obj->pIndexData->vnum,
		escape,
		ch->true_name,
		current_time);
	one_query(query);

	act("You place $p on $P, offering it to your deity.", ch, obj, altar, TO_CHAR);
	act("$n places $s offering of $p on $P.", ch, obj, altar, TO_ROOM);

	extract_obj(obj);
}